

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

void deqp::gles2::Functional::getDistinctSamplerTypes
               (vector<glu::DataType,_std::allocator<glu::DataType>_> *dst,VarType *type)

{
  VarType *pVVar1;
  bool bVar2;
  int iVar3;
  StructType *this;
  StructMember *this_00;
  VarType *pVVar4;
  bool local_4d;
  int local_4c;
  int i;
  StructType *structType;
  DataType *local_38;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  local_30;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  local_28;
  DataType local_1c;
  VarType *pVStack_18;
  DataType basicType;
  VarType *type_local;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *dst_local;
  
  pVStack_18 = type;
  type_local = (VarType *)dst;
  bVar2 = glu::VarType::isBasicType(type);
  if (bVar2) {
    local_1c = glu::VarType::getBasicType(pVStack_18);
    bVar2 = glu::isDataTypeSampler(local_1c);
    local_4d = false;
    if (bVar2) {
      local_30._M_current =
           (DataType *)
           std::vector<glu::DataType,_std::allocator<glu::DataType>_>::begin
                     ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)type_local);
      local_38 = (DataType *)
                 std::vector<glu::DataType,_std::allocator<glu::DataType>_>::end
                           ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)type_local);
      local_28 = std::
                 find<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,glu::DataType>
                           (local_30,(__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                                      )local_38,&local_1c);
      structType = (StructType *)
                   std::vector<glu::DataType,_std::allocator<glu::DataType>_>::end
                             ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)type_local);
      local_4d = __gnu_cxx::operator==
                           (&local_28,
                            (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                             *)&structType);
    }
    if (local_4d != false) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)type_local,&local_1c);
    }
  }
  else {
    bVar2 = glu::VarType::isArrayType(pVStack_18);
    pVVar1 = type_local;
    if (bVar2) {
      pVVar4 = glu::VarType::getElementType(pVStack_18);
      getDistinctSamplerTypes
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)pVVar1,pVVar4);
    }
    else {
      this = glu::VarType::getStructPtr(pVStack_18);
      for (local_4c = 0; iVar3 = glu::StructType::getNumMembers(this), pVVar1 = type_local,
          local_4c < iVar3; local_4c = local_4c + 1) {
        this_00 = glu::StructType::getMember(this,local_4c);
        pVVar4 = glu::StructMember::getType(this_00);
        getDistinctSamplerTypes
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)pVVar1,pVVar4);
      }
    }
  }
  return;
}

Assistant:

static void getDistinctSamplerTypes (vector<glu::DataType>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
	{
		const glu::DataType basicType = type.getBasicType();
		if (glu::isDataTypeSampler(basicType) && std::find(dst.begin(), dst.end(), basicType) == dst.end())
			dst.push_back(basicType);
	}
	else if (type.isArrayType())
		getDistinctSamplerTypes(dst, type.getElementType());
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			getDistinctSamplerTypes(dst, structType.getMember(i).getType());
	}
}